

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

bool sensors_analytics::HttpSender::EncodeToRequestBody(string *data,string *request_body)

{
  bool bVar1;
  long *plVar2;
  long *plVar3;
  string compressed_data;
  string base64_encoded_data;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  string local_b0;
  string local_90;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  string local_50;
  
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  bVar1 = CompressString(data,&local_b0,9);
  if (bVar1) {
    Base64Encode(&local_50,&local_b0);
    utils::UrlEncode(&local_90,&local_50);
    plVar2 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x11c377);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_c0 = *plVar3;
      lStack_b8 = plVar2[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar3;
      local_d0 = (long *)*plVar2;
    }
    local_c8 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar3 = plVar2 + 2;
    if ((long *)*plVar2 == plVar3) {
      local_60 = *plVar3;
      lStack_58 = plVar2[3];
      local_70 = &local_60;
    }
    else {
      local_60 = *plVar3;
      local_70 = (long *)*plVar2;
    }
    local_68 = plVar2[1];
    *plVar2 = (long)plVar3;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    std::__cxx11::string::operator=((string *)request_body,(string *)&local_70);
    if (local_70 != &local_60) {
      operator_delete(local_70);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p);
  }
  return bVar1;
}

Assistant:

bool HttpSender::EncodeToRequestBody(const string &data, string *request_body) {
  string compressed_data;
  if (!CompressString(data, &compressed_data)) {
    return false;
  }
  const string base64_encoded_data = Base64Encode(compressed_data);
  *request_body = "data_list=" + utils::UrlEncode(base64_encoded_data) + "&gzip=1";
  return true;
}